

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O0

uint32_t __thiscall
cppnet::BufferBlock::Read(BufferBlock *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  uint local_48;
  uint32_t read_done_size;
  uint32_t total_size;
  uint32_t len2;
  uint32_t len1;
  void *data2;
  void *data1;
  shared_ptr<cppnet::InnerBuffer> *psStack_20;
  uint32_t len_local;
  shared_ptr<cppnet::InnerBuffer> *buffer_local;
  BufferBlock *this_local;
  
  if (this->_buffer_start == (char *)0x0) {
    this_local._4_4_ = 0;
  }
  else if (((this->_can_read & 1U) == 0) && (this->_read == this->_write)) {
    this_local._4_4_ = 0;
  }
  else {
    data1._4_4_ = len;
    psStack_20 = buffer;
    buffer_local = (shared_ptr<cppnet::InnerBuffer> *)this;
    if (len == 0) {
      data1._4_4_ = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
    }
    data2 = (void *)0x0;
    _len2 = (void *)0x0;
    total_size = 0;
    read_done_size = 0;
    GetUseMemoryBlock(this,&data2,&total_size,(void **)&len2,&read_done_size);
    if (data1._4_4_ < total_size + read_done_size) {
      if ((data1._4_4_ < total_size + read_done_size) && (total_size <= data1._4_4_)) {
        peVar3 = std::
                 __shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)buffer);
        iVar1 = (*(peVar3->super_Buffer)._vptr_Buffer[10])(peVar3,data2,(ulong)total_size);
        peVar3 = std::
                 __shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)buffer);
        iVar2 = (*(peVar3->super_Buffer)._vptr_Buffer[10])
                          (peVar3,_len2,(ulong)(data1._4_4_ - total_size));
        local_48 = iVar2 + iVar1;
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)buffer);
        local_48 = (*(peVar3->super_Buffer)._vptr_Buffer[10])(peVar3,data2,(ulong)data1._4_4_);
      }
    }
    else {
      peVar3 = std::
               __shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)buffer);
      iVar1 = (*(peVar3->super_Buffer)._vptr_Buffer[10])(peVar3,data2,(ulong)total_size);
      peVar3 = std::
               __shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)buffer);
      iVar2 = (*(peVar3->super_Buffer)._vptr_Buffer[10])(peVar3,_len2,(ulong)read_done_size);
      local_48 = iVar2 + iVar1;
    }
    (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[6])(this,(ulong)local_48);
    this_local._4_4_ = local_48;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferBlock::Read(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (!_buffer_start) {
        return 0;
    }

    if(!_can_read && _read == _write) {
        return 0;
    }

    if (len == 0) {
        len = GetCanReadLength();
    }

    void* data1 = nullptr, *data2 = nullptr;
    uint32_t len1 = 0, len2 = 0;

    GetUseMemoryBlock(data1, len1, data2, len2);
    uint32_t total_size = len1 + len2;
    uint32_t read_done_size = 0;
    
    // read all data
    if (len >= total_size) {
        read_done_size += buffer->Write((char*)data1, len1);
        read_done_size += buffer->Write((char*)data2, len2);

    // write part of data
    } else if (len < total_size && len >= len1) {
        read_done_size += buffer->Write((char*)data1, len1);
        read_done_size += buffer->Write((char*)data2, len - len1);

    // write part of data
    } else {
        read_done_size += buffer->Write((char*)data1, len);
    }

    MoveReadPt(read_done_size);
    return read_done_size;
}